

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::Receive(Client *this,int socket)

{
  ssize_t sVar1;
  undefined8 *puVar2;
  ostream *this_00;
  allocator<char> local_441;
  string local_440 [8];
  string msg;
  char local_418 [4];
  int __receive__;
  char buff [1024];
  int socket_local;
  Client *this_local;
  
  buff._1020_4_ = socket;
  memset(local_418,0,0x400);
  sVar1 = recv(this->client_sock,local_418,0x400,0);
  msg.field_2._12_4_ = (undefined4)sVar1;
  if ((int)msg.field_2._12_4_ < 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "Error of receiving!";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_440,"",&local_441);
  std::allocator<char>::~allocator(&local_441);
  std::__cxx11::string::operator+=(local_440,(string *)&this->collocutor);
  std::__cxx11::string::operator+=(local_440,"> ");
  std::__cxx11::string::operator+=(local_440,local_418);
  this_00 = std::operator<<((ostream *)&std::cout,local_440);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_440);
  return;
}

Assistant:

void Client::Receive(int socket) {
    char buff[1024];
    memset(&buff, '\0', sizeof(buff));

    int __receive__ = recv(client_sock, buff, 1024, 0);

    if (__receive__ < 0) {
        throw "Error of receiving!";
        std::cout << "[!] Message has not received!" << std::endl;
        return;
    }

    std::string msg = "";

    msg += this->collocutor;
    msg += "> ";
    msg += buff;

    std::cout << msg << std::endl;
}